

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> * __thiscall
CGL::SceneObjects::SphereObject::get_primitives
          (vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
           *__return_storage_ptr__,SphereObject *this)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  Primitive *local_18;
  
  (__return_storage_ptr__->
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = (Primitive *)operator_new(0x40);
  pp_Var1 = (_func_int **)(this->o).field_0.field_0.z;
  pp_Var2 = (_func_int **)this->r;
  local_18->_vptr_Primitive = (_func_int **)strlen;
  local_18[1]._vptr_Primitive = (_func_int **)this;
  pp_Var3 = (_func_int **)(this->o).field_0.field_0.y;
  local_18[2]._vptr_Primitive = (_func_int **)(this->o).field_0.field_0.x;
  local_18[3]._vptr_Primitive = pp_Var3;
  local_18[4]._vptr_Primitive = pp_Var1;
  local_18[6]._vptr_Primitive = pp_Var2;
  local_18[7]._vptr_Primitive = (_func_int **)((double)pp_Var2 * (double)pp_Var2);
  std::vector<CGL::SceneObjects::Primitive*,std::allocator<CGL::SceneObjects::Primitive*>>::
  emplace_back<CGL::SceneObjects::Primitive*>
            ((vector<CGL::SceneObjects::Primitive*,std::allocator<CGL::SceneObjects::Primitive*>> *)
             __return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Primitive*> SphereObject::get_primitives() const {
  std::vector<Primitive*> primitives;
  primitives.push_back(new Sphere(this,o,r));
  return primitives;
}